

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.h
# Opt level: O3

void __thiscall VmInstruction::~VmInstruction(VmInstruction *this)

{
  (this->super_VmValue)._vptr_VmValue = (_func_int **)&PTR__VmInstruction_00224cd8;
  SmallArray<unsigned_char,_8U>::~SmallArray(&this->regVmRegisters);
  SmallArray<VmValue_*,_4U>::~SmallArray(&this->arguments);
  (this->super_VmValue)._vptr_VmValue = (_func_int **)&PTR__VmValue_00224cb8;
  SmallArray<VmValue_*,_8U>::~SmallArray(&(this->super_VmValue).users);
  operator_delete(this,0x138);
  return;
}

Assistant:

VmInstruction(Allocator *allocator, VmType type, SynBase *source, VmInstructionType cmd, unsigned uniqueId): VmValue(myTypeID, allocator, type, source), cmd(cmd), uniqueId(uniqueId), arguments(allocator), regVmRegisters(allocator)
	{
		parent = NULL;

		prevSibling = NULL;
		nextSibling = NULL;

		regVmAllocated = false;

		regVmCompletedUsers = 0;

		regVmSearchMarker = 0;

		color = 0;
		marker = 0;

		idom = NULL;
		intersectingIdom = NULL;
	}